

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void duckdb_je_arena_destroy(tsd_t *tsd,arena_t *arena)

{
  void *pvVar1;
  tsd_t *tsd_00;
  uint uVar2;
  ulong uVar3;
  uint n_mtx;
  ulong uVar4;
  uint n_delayed;
  malloc_mutex_t *delayed_mtx [32];
  uint local_154;
  tsd_t *local_150;
  arena_t *local_148;
  ulong local_140;
  malloc_mutex_t *local_138 [33];
  
  duckdb_je_pa_shard_destroy((tsdn_t *)tsd,&arena->pa_shard);
  duckdb_je_arena_set((arena->base->ehooks).ind,(arena_t *)0x0);
  if (duckdb_je_opt_retain == false) {
    uVar3 = (ulong)(arena->base->ehooks).ind;
    local_154 = 0;
    uVar2 = duckdb_je_narenas_total_get();
    n_mtx = 0;
    if (uVar2 != 0) {
      uVar4 = 0;
      local_150 = tsd;
      local_148 = arena;
      local_140 = uVar3;
      do {
        tsd_00 = local_150;
        if ((uVar3 != uVar4) && (pvVar1 = duckdb_je_arenas[uVar4].repr, pvVar1 != (void *)0x0)) {
          arena_prepare_base_deletion_sync
                    (local_150,(malloc_mutex_t *)((long)pvVar1 + 0x29f8),local_138,&local_154);
          arena_prepare_base_deletion_sync
                    (tsd_00,(malloc_mutex_t *)((long)pvVar1 + 0x75e8),local_138,&local_154);
          uVar3 = local_140;
          arena_prepare_base_deletion_sync
                    (tsd_00,(malloc_mutex_t *)((long)pvVar1 + 0xc1d8),local_138,&local_154);
        }
        uVar4 = uVar4 + 1;
        tsd = local_150;
        arena = local_148;
        n_mtx = local_154;
      } while (uVar2 != uVar4);
    }
    arena_prepare_base_deletion_sync_finish(tsd,local_138,n_mtx);
  }
  duckdb_je_base_delete((tsdn_t *)tsd,arena->base);
  return;
}

Assistant:

void
arena_destroy(tsd_t *tsd, arena_t *arena) {
	assert(base_ind_get(arena->base) >= narenas_auto);
	assert(arena_nthreads_get(arena, false) == 0);
	assert(arena_nthreads_get(arena, true) == 0);

	/*
	 * No allocations have occurred since arena_reset() was called.
	 * Furthermore, the caller (arena_i_destroy_ctl()) purged all cached
	 * extents, so only retained extents may remain and it's safe to call
	 * pa_shard_destroy_retained.
	 */
	pa_shard_destroy(tsd_tsdn(tsd), &arena->pa_shard);

	/*
	 * Remove the arena pointer from the arenas array.  We rely on the fact
	 * that there is no way for the application to get a dirty read from the
	 * arenas array unless there is an inherent race in the application
	 * involving access of an arena being concurrently destroyed.  The
	 * application must synchronize knowledge of the arena's validity, so as
	 * long as we use an atomic write to update the arenas array, the
	 * application will get a clean read any time after it synchronizes
	 * knowledge that the arena is no longer valid.
	 */
	arena_set(base_ind_get(arena->base), NULL);

	/*
	 * Destroy the base allocator, which manages all metadata ever mapped by
	 * this arena.  The prepare function will make sure no pending access to
	 * the metadata in this base anymore.
	 */
	arena_prepare_base_deletion(tsd, arena->base);
	base_delete(tsd_tsdn(tsd), arena->base);
}